

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readsTable(Parse *p,int iStartAddr,int iDb,Table *pTab)

{
  Vdbe *pVVar1;
  Op *pOVar2;
  undefined4 in_register_00000014;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  
  lVar3 = CONCAT44(in_register_00000014,iDb);
  pVVar1 = sqlite3GetVdbe(p);
  if (((*(byte *)(lVar3 + 0x46) & 0x10) != 0) &&
     (plVar4 = *(long **)(lVar3 + 0x58), plVar4 != (long *)0x0)) {
    do {
      if ((sqlite3 *)*plVar4 == p->db) goto LAB_001716d4;
      plVar4 = (long *)plVar4[5];
    } while (plVar4 != (long *)0x0);
  }
  plVar4 = (long *)0x0;
LAB_001716d4:
  if (0 < pVVar1->nOp) {
    uVar5 = 0;
    do {
      pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (pVVar1->db->mallocFailed == '\0') {
        pOVar2 = pVVar1->aOp + uVar5;
      }
      if (pOVar2->opcode == 0x87) {
        if ((long *)(pOVar2->p4).p == plVar4) {
          return 1;
        }
      }
      else if ((pOVar2->opcode == '\'') && (pOVar2->p3 == iStartAddr)) {
        if (pOVar2->p2 == *(int *)(lVar3 + 0x3c)) {
          return 1;
        }
        for (lVar6 = *(long *)(lVar3 + 0x10); lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x28)) {
          if (pOVar2->p2 == *(int *)(lVar6 + 0x48)) {
            return 1;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)pVVar1->nOp);
  }
  return 0;
}

Assistant:

static int readsTable(Parse *p, int iStartAddr, int iDb, Table *pTab){
  Vdbe *v = sqlite3GetVdbe(p);
  int i;
  int iEnd = sqlite3VdbeCurrentAddr(v);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  VTable *pVTab = IsVirtual(pTab) ? sqlite3GetVTable(p->db, pTab) : 0;
#endif

  for(i=iStartAddr; i<iEnd; i++){
    VdbeOp *pOp = sqlite3VdbeGetOp(v, i);
    assert( pOp!=0 );
    if( pOp->opcode==OP_OpenRead && pOp->p3==iDb ){
      Index *pIndex;
      int tnum = pOp->p2;
      if( tnum==pTab->tnum ){
        return 1;
      }
      for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
        if( tnum==pIndex->tnum ){
          return 1;
        }
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( pOp->opcode==OP_VOpen && pOp->p4.pVtab==pVTab ){
      assert( pOp->p4.pVtab!=0 );
      assert( pOp->p4type==P4_VTAB );
      return 1;
    }
#endif
  }
  return 0;
}